

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O3

ostream * spvtools::utils::operator<<
                    (ostream *os,
                    HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
                    *value)

{
  ostream *poVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  char *pcVar9;
  uint uVar10;
  ulong uVar11;
  ostream local_42;
  byte local_41;
  undefined4 local_40;
  int local_3c;
  char *local_38;
  
  uVar2 = (value->value_).data_;
  pcVar9 = "-";
  if (-1 < (int)uVar2) {
    pcVar9 = "";
  }
  uVar10 = uVar2 >> 0x17 & 0xff;
  uVar3 = uVar2 * 2 & 0xfffffe;
  local_3c = 0;
  if (uVar10 != 0 || uVar3 != 0) {
    local_3c = uVar10 - 0x7f;
  }
  uVar6 = uVar3;
  if ((uVar10 != 0 || uVar3 != 0) && uVar10 == 0) {
    if ((uVar2 >> 0x16 & 1) == 0) {
      uVar6 = uVar2 * 2 & 0x7ffffe;
      uVar4 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> uVar4 == 0; uVar4 = uVar4 - 1) {
        }
      }
      uVar6 = uVar3 << (~(byte)uVar4 + 0x18 & 0x1f);
      local_3c = (uVar4 ^ 0xffffffe0) - 0x76;
    }
    uVar6 = uVar6 * 2 & 0xfffffc;
  }
  iVar8 = 6;
  if ((uVar6 & 0xe) == 0) {
    uVar11 = (ulong)uVar6;
    iVar7 = iVar8;
    do {
      uVar11 = uVar11 >> 4;
      iVar8 = iVar7 + -1;
      if (iVar7 == 1) break;
      uVar4 = uVar6 & 0xf0;
      uVar6 = (uint)uVar11;
      iVar7 = iVar8;
    } while (uVar4 == 0);
  }
  lVar5 = *(long *)(*(long *)os + -0x18);
  poVar1 = os + lVar5;
  local_40 = *(undefined4 *)(os + lVar5 + 0x18);
  if (os[lVar5 + 0xe1] == (ostream)0x1) {
    local_42 = poVar1[0xe0];
  }
  else {
    local_38 = pcVar9;
    local_42 = (ostream)std::ios::widen((char)poVar1);
    poVar1[0xe0] = local_42;
    poVar1[0xe1] = (ostream)0x1;
    pcVar9 = local_38;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar9,(ulong)(uVar2 >> 0x1f));
  std::__ostream_insert<char,std::char_traits<char>>(os,"0x",2);
  local_41 = (uVar10 != 0 || uVar3 != 0) | 0x30;
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_41,1);
  if (iVar8 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(os,".",1);
    lVar5 = *(long *)os;
    *(long *)(os + *(long *)(lVar5 + -0x18) + 0x10) = (long)iVar8;
    poVar1 = os + *(long *)(lVar5 + -0x18);
    if (os[*(long *)(lVar5 + -0x18) + 0xe1] == (ostream)0x0) {
      std::ios::widen((char)poVar1);
      poVar1[0xe1] = (ostream)0x1;
      lVar5 = *(long *)os;
    }
    poVar1[0xe0] = (ostream)0x30;
    *(uint *)(os + *(long *)(lVar5 + -0x18) + 0x18) =
         *(uint *)(os + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)os);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"p",1);
  iVar8 = local_3c;
  *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
       *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) & 0xffffffb5 | 2;
  pcVar9 = "";
  if (-1 < local_3c) {
    pcVar9 = "+";
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar9,(ulong)(-1 < local_3c));
  std::ostream::operator<<(os,iVar8);
  lVar5 = *(long *)os;
  *(undefined4 *)(os + *(long *)(lVar5 + -0x18) + 0x18) = local_40;
  lVar5 = *(long *)(lVar5 + -0x18);
  poVar1 = os + lVar5;
  if (os[lVar5 + 0xe1] == (ostream)0x0) {
    std::ios::widen((char)poVar1);
    poVar1[0xe1] = (ostream)0x1;
  }
  poVar1[0xe0] = local_42;
  return os;
}

Assistant:

T value() const { return value_; }